

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowChain(Parse *pParse,Window *pWin,Window *pList)

{
  sqlite3 *db_00;
  Window *pWVar1;
  ExprList *pEVar2;
  char *local_38;
  char *zErr;
  Window *pExist;
  sqlite3 *db;
  Window *pList_local;
  Window *pWin_local;
  Parse *pParse_local;
  
  if (pWin->zBase != (char *)0x0) {
    db_00 = pParse->db;
    pWVar1 = windowFind(pParse,pList,pWin->zBase);
    if (pWVar1 != (Window *)0x0) {
      local_38 = (char *)0x0;
      if (pWin->pPartition == (ExprList *)0x0) {
        if ((pWVar1->pOrderBy == (ExprList *)0x0) || (pWin->pOrderBy == (ExprList *)0x0)) {
          if (pWVar1->bImplicitFrame == '\0') {
            local_38 = "frame specification";
          }
        }
        else {
          local_38 = "ORDER BY clause";
        }
      }
      else {
        local_38 = "PARTITION clause";
      }
      if (local_38 == (char *)0x0) {
        pEVar2 = sqlite3ExprListDup(db_00,pWVar1->pPartition,0);
        pWin->pPartition = pEVar2;
        if (pWVar1->pOrderBy != (ExprList *)0x0) {
          pEVar2 = sqlite3ExprListDup(db_00,pWVar1->pOrderBy,0);
          pWin->pOrderBy = pEVar2;
        }
        sqlite3DbFree(db_00,pWin->zBase);
        pWin->zBase = (char *)0x0;
      }
      else {
        sqlite3ErrorMsg(pParse,"cannot override %s of window: %s",local_38,pWin->zBase);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowChain(Parse *pParse, Window *pWin, Window *pList){
  if( pWin->zBase ){
    sqlite3 *db = pParse->db;
    Window *pExist = windowFind(pParse, pList, pWin->zBase);
    if( pExist ){
      const char *zErr = 0;
      /* Check for errors */
      if( pWin->pPartition ){
        zErr = "PARTITION clause";
      }else if( pExist->pOrderBy && pWin->pOrderBy ){
        zErr = "ORDER BY clause";
      }else if( pExist->bImplicitFrame==0 ){
        zErr = "frame specification";
      }
      if( zErr ){
        sqlite3ErrorMsg(pParse, 
            "cannot override %s of window: %s", zErr, pWin->zBase
        );
      }else{
        pWin->pPartition = sqlite3ExprListDup(db, pExist->pPartition, 0);
        if( pExist->pOrderBy ){
          assert( pWin->pOrderBy==0 );
          pWin->pOrderBy = sqlite3ExprListDup(db, pExist->pOrderBy, 0);
        }
        sqlite3DbFree(db, pWin->zBase);
        pWin->zBase = 0;
      }
    }
  }
}